

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmListFileBacktrace __thiscall cmListFileBacktrace::Push(cmListFileBacktrace *this,string *file)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  cmListFileBacktrace cVar1;
  cmListFileContext lfc;
  undefined1 local_58 [32];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  long local_18;
  
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = 0;
  local_58[0x10] = '\0';
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_18 = 0;
  std::__cxx11::string::_M_assign((string *)&local_38);
  Push(this,(cmListFileContext *)file);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_58);
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(std::string const& file) const
{
  // We are entering a file-level scope but have not yet reached
  // any specific line or command invocation within it.  This context
  // is useful to print when it is at the top but otherwise can be
  // skipped during call stack printing.
  cmListFileContext lfc;
  lfc.FilePath = file;
  return this->Push(lfc);
}